

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void makewt(int nw,int *ip,double *w)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double wn4r;
  double delta;
  int nw1;
  int nw0;
  int nwh;
  int j;
  double *w_local;
  int *ip_local;
  int nw_local;
  
  *ip = nw;
  ip[1] = 1;
  if (2 < nw) {
    nw1 = nw >> 1;
    dVar3 = atan(1.0);
    dVar3 = dVar3 / (double)nw1;
    dVar4 = cos(dVar3 * (double)nw1);
    *w = 1.0;
    w[1] = dVar4;
    if (nw1 == 4) {
      dVar5 = cos(dVar3 * 2.0);
      w[2] = dVar5;
      dVar3 = sin(dVar3 * 2.0);
      w[3] = dVar3;
    }
    else if (4 < nw1) {
      makeipt(nw,ip);
      dVar5 = cos(dVar3 * 2.0);
      w[2] = 0.5 / dVar5;
      dVar5 = cos(dVar3 * 6.0);
      w[3] = 0.5 / dVar5;
      for (nw0 = 4; nw0 < nw1; nw0 = nw0 + 4) {
        dVar5 = cos(dVar3 * (double)nw0);
        w[nw0] = dVar5;
        dVar5 = sin(dVar3 * (double)nw0);
        w[nw0 + 1] = dVar5;
        dVar5 = cos(dVar3 * 3.0 * (double)nw0);
        w[nw0 + 2] = dVar5;
        dVar5 = sin(dVar3 * 3.0 * (double)nw0);
        w[nw0 + 3] = -dVar5;
      }
    }
    delta._4_4_ = 0;
    iVar2 = delta._4_4_;
    while (delta._4_4_ = iVar2, 2 < nw1) {
      iVar2 = delta._4_4_ + nw1;
      nw1 = nw1 >> 1;
      w[iVar2] = 1.0;
      w[iVar2 + 1] = dVar4;
      if (nw1 == 4) {
        dVar3 = w[delta._4_4_ + 5];
        w[iVar2 + 2] = w[delta._4_4_ + 4];
        w[iVar2 + 3] = dVar3;
      }
      else if (4 < nw1) {
        dVar3 = w[delta._4_4_ + 6];
        w[iVar2 + 2] = 0.5 / w[delta._4_4_ + 4];
        w[iVar2 + 3] = 0.5 / dVar3;
        for (nw0 = 4; nw0 < nw1; nw0 = nw0 + 4) {
          dVar3 = w[delta._4_4_ + nw0 * 2 + 1];
          dVar5 = w[delta._4_4_ + nw0 * 2 + 2];
          dVar1 = w[delta._4_4_ + nw0 * 2 + 3];
          w[iVar2 + nw0] = w[delta._4_4_ + nw0 * 2];
          w[iVar2 + nw0 + 1] = dVar3;
          w[iVar2 + nw0 + 2] = dVar5;
          w[iVar2 + nw0 + 3] = dVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void makewt(int nw, int *ip, double *w) {
  void makeipt(int nw, int *ip);
  int j, nwh, nw0, nw1;
  double delta, wn4r, wk1r, wk1i, wk3r, wk3i;

  ip[0] = nw;
  ip[1] = 1;
  if (nw > 2) {
    nwh = nw >> 1;
    delta = atan(1.0) / nwh;
    wn4r = cos(delta * nwh);
    w[0] = 1;
    w[1] = wn4r;
    if (nwh == 4) {
      w[2] = cos(delta * 2);
      w[3] = sin(delta * 2);
    } else if (nwh > 4) {
      makeipt(nw, ip);
      w[2] = 0.5 / cos(delta * 2);
      w[3] = 0.5 / cos(delta * 6);
      for (j = 4; j < nwh; j += 4) {
        w[j] = cos(delta * j);
        w[j + 1] = sin(delta * j);
        w[j + 2] = cos(3 * delta * j);
        w[j + 3] = -sin(3 * delta * j);
      }
    }
    nw0 = 0;
    while (nwh > 2) {
      nw1 = nw0 + nwh;
      nwh >>= 1;
      w[nw1] = 1;
      w[nw1 + 1] = wn4r;
      if (nwh == 4) {
        wk1r = w[nw0 + 4];
        wk1i = w[nw0 + 5];
        w[nw1 + 2] = wk1r;
        w[nw1 + 3] = wk1i;
      } else if (nwh > 4) {
        wk1r = w[nw0 + 4];
        wk3r = w[nw0 + 6];
        w[nw1 + 2] = 0.5 / wk1r;
        w[nw1 + 3] = 0.5 / wk3r;
        for (j = 4; j < nwh; j += 4) {
          wk1r = w[nw0 + 2 * j];
          wk1i = w[nw0 + 2 * j + 1];
          wk3r = w[nw0 + 2 * j + 2];
          wk3i = w[nw0 + 2 * j + 3];
          w[nw1 + j] = wk1r;
          w[nw1 + j + 1] = wk1i;
          w[nw1 + j + 2] = wk3r;
          w[nw1 + j + 3] = wk3i;
        }
      }
      nw0 = nw1;
    }
  }
}